

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdp.cpp
# Opt level: O2

int __thiscall CMDPACTION::GetIndofMostLikelyOutcome(CMDPACTION *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  uVar2 = (ulong)((long)(this->SuccsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->SuccsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  uVar4 = 0;
  uVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  uVar2 = 0xffffffffffffffff;
  dVar5 = 0.0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    dVar6 = (double)(this->SuccsProb).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4];
    bVar1 = dVar5 <= dVar6;
    dVar5 = (double)(-(ulong)(dVar6 < dVar5) & (ulong)dVar5 |
                    ~-(ulong)(dVar6 < dVar5) & (ulong)dVar6);
    if (bVar1) {
      uVar2 = uVar4;
    }
    uVar2 = uVar2 & 0xffffffff;
  }
  return (int)uVar2;
}

Assistant:

int CMDPACTION::GetIndofMostLikelyOutcome()
{
    double HighestProb = 0;
    int mlind = -1;

    for (int oind = 0; oind < (int)this->SuccsID.size(); oind++) {
        if (this->SuccsProb[oind] >= HighestProb) {
            mlind = oind;
            HighestProb = this->SuccsProb[oind];
        }
    }

    return mlind;
}